

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeSamplerCase::setupTest(DecodeSamplerCase *this)

{
  pointer *pppSVar1;
  GLuint GVar2;
  glSamplerParameteriFunc p_Var3;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  *p_Var4;
  int iVar5;
  deUint32 dVar6;
  GLenum err;
  SRGBTestSampler *pSVar7;
  undefined4 extraout_var;
  ulong uVar8;
  pointer __dest;
  _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  *this_00;
  ulong uVar9;
  Vec4 *in_R8;
  WrapMode in_R9D;
  ulong uVar10;
  size_t __n;
  WrapMode in_stack_ffffffffffffff28;
  FilterMode in_stack_ffffffffffffff30;
  FragmentShaderParameters shaderParameters;
  
  shaderParameters.functionName._M_dataplus._M_p = (pointer)&shaderParameters.functionName.field_2;
  shaderParameters._0_8_ = &DAT_100000001;
  shaderParameters.functionName._M_string_length = 0;
  shaderParameters.functionName.field_2._M_local_buf[0] = '\0';
  shaderParameters.functionImplementation._M_dataplus._M_p =
       (pointer)&shaderParameters.functionImplementation.field_2;
  shaderParameters.functionImplementation._M_string_length = 0;
  shaderParameters.functionImplementation.field_2._M_local_buf[0] = '\0';
  shaderParameters._92_8_ = &DAT_100000001;
  shaderParameters.uniformsToToggle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shaderParameters.uniformsToToggle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  shaderParameters.uniformsToToggle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shaderParameters.hasFunction = false;
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,(TextureType)&stack0xffffffffffffff38,0,
             (int)shaderParameters.functionImplementation._M_dataplus._M_p,in_R8,in_R9D,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,0x3e4ccccd,0x3ecccccd);
  pSVar7 = (SRGBTestSampler *)operator_new(0x28);
  iVar5 = (*((this->super_SRGBTestCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
            [3])();
  pSVar7->m_gl = (Functions *)CONCAT44(extraout_var,iVar5);
  pSVar7->m_wrapS = MIRRORED_REPEAT_GL;
  pSVar7->m_wrapT = MIRRORED_REPEAT_GL;
  *(undefined1 **)&pSVar7->m_minFilter = &DAT_100000001;
  pSVar7->m_isActive = false;
  (*((Functions *)CONCAT44(extraout_var,iVar5))->genSamplers)(1,&pSVar7->m_samplerHandle);
  p_Var3 = pSVar7->m_gl->samplerParameteri;
  GVar2 = pSVar7->m_samplerHandle;
  dVar6 = glu::getGLWrapMode(pSVar7->m_wrapS);
  (*p_Var3)(GVar2,0x2802,dVar6);
  p_Var3 = pSVar7->m_gl->samplerParameteri;
  GVar2 = pSVar7->m_samplerHandle;
  dVar6 = glu::getGLWrapMode(pSVar7->m_wrapT);
  (*p_Var3)(GVar2,0x2803,dVar6);
  p_Var3 = pSVar7->m_gl->samplerParameteri;
  GVar2 = pSVar7->m_samplerHandle;
  dVar6 = glu::getGLFilterMode(pSVar7->m_minFilter);
  (*p_Var3)(GVar2,0x2801,dVar6);
  p_Var3 = pSVar7->m_gl->samplerParameteri;
  GVar2 = pSVar7->m_samplerHandle;
  dVar6 = glu::getGLFilterMode(pSVar7->m_magFilter);
  (*p_Var3)(GVar2,0x2800,dVar6);
  (*pSVar7->m_gl->samplerParameteri)(pSVar7->m_samplerHandle,0x8a48,0x8a49);
  err = (*pSVar7->m_gl->getError)();
  glu::checkError(err,"samplerParameteri(m_samplerID, GL_TEXTURE_SRGB_DECODE_EXT, GL_DECODE_EXT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
                  ,0x172);
  pSVar7->m_decoding = SRGBDECODE_DECODE;
  p_Var4 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
            *)(this->super_SRGBTestCase).m_samplerList.
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var4 == (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                 *)(this->super_SRGBTestCase).m_samplerList.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = (_Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
               *)(this->super_SRGBTestCase).m_samplerList.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    __n = (long)p_Var4 - (long)this_00;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar10 = (long)__n >> 3;
    uVar8 = 1;
    if (p_Var4 != this_00) {
      uVar8 = uVar10;
    }
    uVar9 = uVar8 + uVar10;
    if (0xffffffffffffffe < uVar9) {
      uVar9 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar8,uVar10)) {
      uVar9 = 0xfffffffffffffff;
    }
    if (uVar9 == 0) {
      __dest = (pointer)0x0;
    }
    else {
      __dest = (pointer)operator_new(uVar9 * 8);
    }
    __dest[uVar10] = pSVar7;
    if (0 < (long)__n) {
      memmove(__dest,this_00,__n);
    }
    std::
    _Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
    ::_M_deallocate(this_00,(pointer)((long)(this->super_SRGBTestCase).m_samplerList.
                                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)this_00 >> 3),(size_t)this_00);
    (this->super_SRGBTestCase).m_samplerList.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
    ._M_impl.super__Vector_impl_data._M_start = __dest;
    (this->super_SRGBTestCase).m_samplerList.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n + 8);
    (this->super_SRGBTestCase).m_samplerList.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar9;
  }
  else {
    (p_Var4->_M_impl).super__Vector_impl_data._M_start = (pointer)pSVar7;
    pppSVar1 = &(this->super_SRGBTestCase).m_samplerList.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,&shaderParameters);
  (*(this->super_SRGBTestCase).m_textureSourceList.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_start)->m_hasSampler = true;
  pSVar7 = *(this->super_SRGBTestCase).m_samplerList.
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar7->m_textureUnit = 0;
  pSVar7->m_isActive = true;
  (this->super_SRGBTestCase).m_py = 0;
  (this->super_SRGBTestCase).m_samplingGroup = SHADERSAMPLINGGROUP_TEXTURE;
  (this->super_SRGBTestCase).m_px = 0;
  FragmentShaderParameters::~FragmentShaderParameters(&shaderParameters);
  return;
}

Assistant:

void DecodeSamplerCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture_a to DECODE_SKIP_EXT
	//	- upload texture to the GPU and bind to sampler
	//	- sample texture using texture*()
	//	- read texel values back to the CPU
	//	- compare the texel values, should be in sampler format (linear)

	FragmentShaderParameters shaderParameters(SHADEROUTPUTS_ONE, SHADERUNIFORMS_ONE, NULL, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addSampler(	tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE);

	this->addShaderProgram(shaderParameters);

	this->bindSamplerToTexture(0, 0, GL_TEXTURE0);
	this->activateSampler(0, true);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);
	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}